

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.hpp
# Opt level: O1

longlong game::CountBFS<uttt::IBoard>(int depth)

{
  pointer *ppIVar1;
  iterator __position;
  void *pvVar2;
  pointer plVar3;
  int iVar4;
  ulong uVar5;
  longlong lVar6;
  pointer pIVar7;
  pointer plVar8;
  pointer pIVar9;
  long lVar10;
  initializer_list<uttt::IBoard> __l;
  vector<long,_std::allocator<long>_> moves;
  IBoard ng;
  long m;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> levels [2];
  int local_b4;
  pointer local_b0;
  pointer local_a8;
  IBoard local_98;
  ulong local_80;
  pointer local_78;
  long local_70;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> local_68;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  
  uttt::IBoard::IBoard((IBoard *)&local_b0);
  lVar6 = 1;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_b0;
  std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::vector
            (&local_68,__l,(allocator_type *)&local_98);
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0;
  if (0 < depth) {
    local_b4 = 0;
    lVar6 = 1;
    local_80 = 0;
    do {
      uVar5 = (ulong)(1 - (int)local_80);
      pIVar7 = *(pointer *)(&local_68 + uVar5);
      if ((&local_68)[uVar5].super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>._M_impl
          .super__Vector_impl_data._M_finish != pIVar7) {
        (&local_68)[uVar5].super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>._M_impl.
        super__Vector_impl_data._M_finish = pIVar7;
      }
      pIVar7 = (&local_68)[local_80 & 0xffffffff].
               super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>._M_impl.
               super__Vector_impl_data._M_start;
      pIVar9 = (&local_68)[local_80 & 0xffffffff].
               super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_80 = uVar5;
      local_78 = pIVar9;
      if (pIVar7 != pIVar9) {
        do {
          iVar4 = uttt::IBoard::GetStatus(pIVar7);
          if (iVar4 == -1) {
            uttt::IBoard::GetPossibleMoves((vector<long,_std::allocator<long>_> *)&local_b0,pIVar7);
            plVar3 = local_a8;
            for (plVar8 = local_b0; plVar8 != plVar3; plVar8 = plVar8 + 1) {
              local_70 = *plVar8;
              local_98._16_8_ = *(undefined8 *)((pIVar7->micro)._M_elems + 6);
              local_98.macro = pIVar7->macro;
              local_98.micro._M_elems[0] = (pIVar7->micro)._M_elems[0];
              local_98.micro._M_elems[1] = (pIVar7->micro)._M_elems[1];
              local_98.micro._M_elems._4_8_ = *(undefined8 *)((pIVar7->micro)._M_elems + 2);
              uttt::IBoard::ApplyMove(&local_98,&local_70);
              __position._M_current =
                   (&local_68)[uVar5].
                   super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (&local_68)[uVar5].super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<uttt::IBoard,std::allocator<uttt::IBoard>>::
                _M_realloc_insert<uttt::IBoard&>
                          ((vector<uttt::IBoard,std::allocator<uttt::IBoard>> *)(&local_68 + uVar5),
                           __position,&local_98);
              }
              else {
                *(undefined8 *)(((__position._M_current)->micro)._M_elems + 6) = local_98._16_8_;
                (__position._M_current)->macro = local_98.macro;
                ((__position._M_current)->micro)._M_elems[0] = local_98.micro._M_elems[0];
                ((__position._M_current)->micro)._M_elems[1] = local_98.micro._M_elems[1];
                *(undefined8 *)(((__position._M_current)->micro)._M_elems + 2) =
                     local_98.micro._M_elems._4_8_;
                ppIVar1 = &(&local_68)[uVar5].
                           super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                *ppIVar1 = *ppIVar1 + 1;
              }
              lVar6 = lVar6 + 1;
            }
            pIVar9 = local_78;
            if (local_b0 != (pointer)0x0) {
              operator_delete(local_b0);
              pIVar9 = local_78;
            }
          }
          pIVar7 = pIVar7 + 1;
        } while (pIVar7 != pIVar9);
      }
      local_b4 = local_b4 + 1;
    } while (local_b4 != depth);
  }
  lVar10 = 0x18;
  do {
    pvVar2 = *(void **)((long)&local_68.
                               super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar10);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2);
    }
    lVar10 = lVar10 + -0x18;
  } while (lVar10 != -0x18);
  return lVar6;
}

Assistant:

long long
CountBFS(int depth)
{
    long long total = 1;
    std::vector<IGame> levels[2] = {{{}}};
    int current_level = 0;
    for (int i = 0; i < depth; ++i)
    {
        levels[1 - current_level].clear();
        for (const auto &g : levels[current_level])
        {
            if (g.GetStatus() != Undecided)
                continue;
            auto moves = g.GetPossibleMoves();
            for (auto m : moves)
            {
                auto ng = g;
                ng.ApplyMove(m);
                levels[1 - current_level].emplace_back(ng);
                ++total;
            }
        }
        current_level = 1 - current_level;
    }
    return total;
}